

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O2

void __thiscall
Imf_3_2::SimdAlignedBuffer64<unsigned_short>::alloc(SimdAlignedBuffer64<unsigned_short> *this)

{
  unsigned_short *__ptr;
  char *pcVar1;
  
  __ptr = (unsigned_short *)EXRAllocAligned(0x80,0x20);
  this->_handle = (char *)__ptr;
  if (((ulong)__ptr & 0x1f) != 0) {
    free(__ptr);
    pcVar1 = (char *)EXRAllocAligned(0xa0,0x20);
    this->_handle = pcVar1;
    __ptr = (unsigned_short *)(pcVar1 + (-(int)pcVar1 & 0x1f));
  }
  this->_buffer = __ptr;
  return;
}

Assistant:

void alloc ()
    {
        //
        // Try EXRAllocAligned first - but it might fallback to
        // unaligned allocs. If so, overalloc.
        //

        _handle = (char*) EXRAllocAligned (64 * sizeof (T), _SSE_ALIGNMENT);

        if (((size_t) _handle & (_SSE_ALIGNMENT - 1)) == 0)
        {
            _buffer = (T*) _handle;
            return;
        }

        EXRFreeAligned (_handle);
        _handle = (char*) EXRAllocAligned (
            64 * sizeof (T) + _SSE_ALIGNMENT, _SSE_ALIGNMENT);

        char* aligned = _handle;

        while ((size_t) aligned & (_SSE_ALIGNMENT - 1))
            aligned++;

        _buffer = (T*) aligned;
    }